

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

int main(void)

{
  Logger *this;
  undefined1 local_358 [8];
  EchoServer server;
  EventLoop base_loop;
  
  this = Logger::get_instance();
  Logger::init(this,(EVP_PKEY_CTX *)0x0);
  EventLoop::EventLoop((EventLoop *)&server.es_loop);
  EchoServer::EchoServer((EchoServer *)local_358,(EventLoop *)&server.es_loop,"127.0.0.1",0x22b8);
  EchoServer::set_tcp_cn_timeout_ms((EchoServer *)local_358,8000);
  EchoServer::start((EchoServer *)local_358,2);
  EventLoop::loop((EventLoop *)&server.es_loop);
  EchoServer::~EchoServer((EchoServer *)local_358);
  EventLoop::~EventLoop((EventLoop *)&server.es_loop);
  return 0;
}

Assistant:

int main()
{   
    Logger::get_instance()->init(NULL);

    EventLoop base_loop;
    EchoServer server(&base_loop, "127.0.0.1", 8888);
    server.set_tcp_cn_timeout_ms(8000);
    server.start(2);
    base_loop.loop();
    
    return 0;
}